

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackPropertiesGenerator::GenerateScriptForConfig
          (cmCPackPropertiesGenerator *this,ostream *os,string *config,Indent indent)

{
  cmInstalledFile *pcVar1;
  _Base_ptr p_Var2;
  cmCompiledGeneratorExpression *this_00;
  string *str;
  ostream *poVar3;
  string *psVar4;
  _Base_ptr p_Var5;
  value_type *j;
  _Base_ptr p_Var6;
  string value;
  string local_70;
  string local_50;
  
  this_00 = cmInstalledFile::GetNameExpression(this->InstalledFile);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  str = cmCompiledGeneratorExpression::Evaluate
                  (this_00,this->LG,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                   (cmGeneratorExpressionDAGChecker *)0x0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = this->InstalledFile;
  for (p_Var5 = (pcVar1->Properties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pcVar1->Properties)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar3 = std::operator<<(poVar3,"set_property(INSTALL ");
    cmOutputConverter::EscapeForCMake(&local_50,str);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3," PROPERTY ");
    cmOutputConverter::EscapeForCMake(&local_70,(string *)(p_Var5 + 1));
    std::operator<<(poVar3,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    p_Var2 = p_Var5[2]._M_parent;
    for (p_Var6 = *(_Base_ptr *)(p_Var5 + 2); p_Var6 != p_Var2;
        p_Var6 = (_Base_ptr)&p_Var6->_M_parent) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      psVar4 = cmCompiledGeneratorExpression::Evaluate
                         (*(cmCompiledGeneratorExpression **)p_Var6,this->LG,config,false,
                          (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                          (cmGeneratorExpressionDAGChecker *)0x0,&local_70);
      std::__cxx11::string::string((string *)&local_50,(string *)psVar4);
      std::__cxx11::string::~string((string *)&local_70);
      poVar3 = std::operator<<(os," ");
      cmOutputConverter::EscapeForCMake(&local_70,&local_50);
      std::operator<<(poVar3,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::operator<<(os,")\n");
  }
  return;
}

Assistant:

void cmCPackPropertiesGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::string const& expandedFileName =
    this->InstalledFile.GetNameExpression().Evaluate(this->LG, config);

  cmInstalledFile::PropertyMapType const& properties =
    this->InstalledFile.GetProperties();

  for (cmInstalledFile::PropertyMapType::value_type const& i : properties) {
    std::string const& name = i.first;
    cmInstalledFile::Property const& property = i.second;

    os << indent << "set_property(INSTALL "
       << cmOutputConverter::EscapeForCMake(expandedFileName) << " PROPERTY "
       << cmOutputConverter::EscapeForCMake(name);

    for (cmInstalledFile::ExpressionVectorType::value_type const& j :
         property.ValueExpressions) {
      std::string value = j->Evaluate(this->LG, config);
      os << " " << cmOutputConverter::EscapeForCMake(value);
    }

    os << ")\n";
  }
}